

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O1

void LTWeather::FillUp(array<float,_13UL> *levels_m,array<float,_13UL> *to,float alt_m,float val,
                      bool bInterpolateNext)

{
  size_t i;
  
  i = 0;
  do {
    if (alt_m < levels_m->_M_elems[i]) goto LAB_001a1629;
    to->_M_elems[i] = val;
    i = i + 1;
  } while (i != 0xd);
  i = 0xd;
LAB_001a1629:
  if (bInterpolateNext && i - 1 < 0xb) {
    to->_M_elems[i] =
         ((to->_M_elems[i + 1] - to->_M_elems[i - 1]) *
         ((float)*(undefined8 *)(levels_m->_M_elems + i) - levels_m->_M_elems[i - 1])) /
         ((float)((ulong)*(undefined8 *)(levels_m->_M_elems + i) >> 0x20) -
         levels_m->_M_elems[i - 1]) + to->_M_elems[i - 1];
  }
  return;
}

Assistant:

void LTWeather::FillUp (const std::array<float,13>& levels_m,
                        std::array<float,13>& to,
                        float alt_m,
                        float val,
                        bool bInterpolateNext)
{
    std::size_t i = 0;
    for (; i < levels_m.size() && levels_m[i] <= alt_m; ++i)    // while level is less than alt_m set value
        to[i] = val;
    // i now points to first element _after_ those we set to 'val'
    if (bInterpolateNext && i >= 1 && i+1 < levels_m.size()) {        // to align with values above interpolate the next value
        to[i] = to[i-1] + (to[i+1]-to[i-1])*(levels_m[i]-levels_m[i-1])/(levels_m[i+1]-levels_m[i-1]);
    }
}